

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Parameter::Parameter(Parameter *this,Parameter *param_1)

{
  bool bVar1;
  Parameter *param_1_local;
  Parameter *this_local;
  
  bVar1 = param_1->has_number_value;
  this->bool_value = param_1->bool_value;
  this->has_number_value = bVar1;
  std::__cxx11::string::string((string *)&this->string_value,(string *)&param_1->string_value);
  std::vector<double,_std::allocator<double>_>::vector(&this->number_array,&param_1->number_array);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(&this->json_double_value,&param_1->json_double_value);
  this->number_value = param_1->number_value;
  return;
}

Assistant:

Parameter() = default;